

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O1

int __thiscall PGSStreamReader::readObjectDef(PGSStreamReader *this,uint8_t *pos,uint8_t *end)

{
  ushort uVar1;
  pointer puVar2;
  pointer puVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  mapped_type_conflict1 *pmVar6;
  ostream *poVar7;
  undefined4 *puVar8;
  int iVar9;
  uint8_t *__src;
  uint16_t object_id;
  BitmapInfo bmpRef;
  ostringstream ss;
  key_type_conflict4 local_1e2;
  uint *local_1e0;
  undefined8 local_1d8;
  uint local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  uint8_t *local_1c0;
  BitmapInfo local_1b8;
  BitmapInfo local_1a8 [23];
  
  uVar5 = AV_RB24(pos + 4);
  iVar9 = 1;
  if (pos + (ulong)uVar5 + 7 <= (this->super_AbstractStreamReader).m_bufEnd) {
    local_1c0 = pos + 7;
    puVar2 = (this->m_dstRle).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_dstRle).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar2) {
      (this->m_dstRle).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (&this->m_dstRle,(ulong)uVar5);
    uVar4 = AV_RB16(local_1c0);
    this->object_width = uVar4;
    uVar4 = AV_RB16(pos + 9);
    this->object_height = uVar4;
    local_1e2 = 0;
    if (4 < uVar5) {
      __src = pos + 0xb;
      do {
        if (end <= __src) {
          if (*__src != '\x15') {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Unexpected byte ",0x10);
            local_1b8.Width = CONCAT31(local_1b8.Width._1_3_,*__src);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(char *)&local_1b8,1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7," during parsing Object definition segment",0x29);
            puVar8 = (undefined4 *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            *puVar8 = 3;
            *(undefined4 **)(puVar8 + 2) = puVar8 + 6;
            if (local_1e0 == &local_1d0) {
              puVar8[6] = local_1d0;
              puVar8[7] = uStack_1cc;
              puVar8[8] = uStack_1c8;
              puVar8[9] = uStack_1c4;
            }
            else {
              *(uint **)(puVar8 + 2) = local_1e0;
              *(ulong *)(puVar8 + 6) = CONCAT44(uStack_1cc,local_1d0);
            }
            *(undefined8 *)(puVar8 + 4) = local_1d8;
            local_1d8 = 0;
            local_1d0 = local_1d0 & 0xffffff00;
            local_1e0 = &local_1d0;
            __cxa_throw(puVar8,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
          uVar4 = AV_RB16(__src + 1);
          end = __src + (ulong)uVar4 + 1;
          local_1e2 = AV_RB16(__src + 3);
          __src = __src + 7;
        }
        puVar2 = (this->m_dstRle).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        puVar3 = (this->m_dstRle).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this->m_dstRle,(size_type)(end + (long)(puVar2 + (-(long)__src - (long)puVar3)))
                  );
        memcpy(puVar2 + ((long)(this->m_dstRle).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start - (long)puVar3),__src,
               (long)end - (long)__src);
        __src = end;
      } while (end < pos + (ulong)uVar5 + 7);
    }
    if (this->m_needRescale == true) {
      pmVar6 = std::
               map<unsigned_short,_unsigned_short,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
               ::operator[](&this->composition_object_horizontal_position,&local_1e2);
      uVar1 = *pmVar6;
      pmVar6 = std::
               map<unsigned_short,_unsigned_short,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
               ::operator[](&this->composition_object_vertical_position,&local_1e2);
      decodeRleData(this,(uint)uVar1,(uint)*pmVar6);
      iVar9 = 0x21;
      if (this->m_fontBorder == 0) {
        iVar9 = 0;
      }
      yuvToRgb(this,iVar9);
      local_1b8.buffer = (RGBQUAD *)this->m_rgbBuffer;
      local_1b8.Width = (int)this->m_video_width;
      local_1b8.Height = (int)this->m_video_height;
      local_1a8[0].buffer = (RGBQUAD *)this->m_scaledRgbBuffer;
      local_1a8[0].Width = (int)this->m_scaled_width;
      local_1a8[0].Height = (int)this->m_scaled_height;
      rescaleRGB(local_1a8,&local_1b8);
      if (this->m_fontBorder != 0) {
        text_subtitles::TextSubtitlesRender::addBorder
                  (this->m_fontBorder,this->m_scaledRgbBuffer,(uint)this->m_scaled_width,
                   (uint)this->m_scaled_height);
      }
    }
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

int PGSStreamReader::readObjectDef(const uint8_t* pos, const uint8_t* end)
{
    pos += 4;  // skip object ID and version number
    const uint32_t objectSize = AV_RB24(pos);
    pos += 3;
    const uint8_t* objEnd = pos + objectSize;

    if (m_bufEnd < objEnd)
        return NEED_MORE_DATA;

    m_dstRle.clear();
    m_dstRle.reserve(objectSize);

    object_width = AV_RB16(pos);
    pos += 2;
    object_height = AV_RB16(pos);
    pos += 2;
    uint16_t object_id = 0;
    while (pos < objEnd)
    {
        if (pos >= end)
        {
            if (*pos != OBJECT_DEF_SEGMENT)
                THROW(ERR_COMMON, "Unexpected byte " << *pos << " during parsing Object definition segment")
            pos++;  // skip OBJECT_DEF_SEGMENT
            end = pos + AV_RB16(pos);
            pos += 2;
            object_id = AV_RB16(pos);
            pos += 4;  // skip object ID and version number
        }
        const size_t oldSize = m_dstRle.size();
        m_dstRle.resize(oldSize + end - pos);
        memcpy(&m_dstRle[oldSize], pos, end - pos);
        pos += end - pos;
    }
    if (m_needRescale)
    {
        decodeRleData(composition_object_horizontal_position[object_id],
                      composition_object_vertical_position[object_id]);
        yuvToRgb(m_fontBorder ? Y_THRESHOLD : 0);
        BitmapInfo bmpDest;
        BitmapInfo bmpRef;

        bmpRef.buffer = reinterpret_cast<RGBQUAD*>(m_rgbBuffer);
        bmpRef.Width = m_video_width;
        bmpRef.Height = m_video_height;
        bmpDest.buffer = reinterpret_cast<RGBQUAD*>(m_scaledRgbBuffer);
        bmpDest.Width = m_scaled_width;
        bmpDest.Height = m_scaled_height;

        rescaleRGB(&bmpDest, &bmpRef);
        if (m_fontBorder)
            TextSubtitlesRender::addBorder(m_fontBorder, m_scaledRgbBuffer, m_scaled_width, m_scaled_height);
        // memcpy(bmpDest.buffer, bmpRef.buffer, bmpDest.Width * bmpDest.Height * 4);
    }
    return 0;
}